

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

unsigned_long ndiHexToUnsignedLong(char *string,int n)

{
  int iVar1;
  ulong uStack_20;
  int c;
  unsigned_long result;
  int i;
  int n_local;
  char *string_local;
  
  uStack_20 = 0;
  result._0_4_ = 0;
  do {
    if (n <= (int)result) {
      return uStack_20;
    }
    iVar1 = (int)string[(int)result];
    if ((iVar1 < 0x61) || (0x66 < iVar1)) {
      if ((iVar1 < 0x41) || (0x46 < iVar1)) {
        if (iVar1 < 0x30) {
          return uStack_20;
        }
        if (0x39 < iVar1) {
          return uStack_20;
        }
        uStack_20 = uStack_20 << 4 | (long)(iVar1 + -0x30);
      }
      else {
        uStack_20 = uStack_20 << 4 | (long)(iVar1 + -0x37);
      }
    }
    else {
      uStack_20 = uStack_20 << 4 | (long)(iVar1 + -0x57);
    }
    result._0_4_ = (int)result + 1;
  } while( true );
}

Assistant:

ndicapiExport unsigned long ndiHexToUnsignedLong(const char* string, int n)
{
  int i;
  unsigned long result = 0;
  int c;

  for (i = 0; i < n; i++)
  {
    c = string[i];
    if (c >= 'a' && c <= 'f')
    {
      result = (result << 4) | (c + (10 - 'a'));
    }
    else if (c >= 'A' && c <= 'F')
    {
      result = (result << 4) | (c + (10 - 'A'));
    }
    else if (c >= '0' && c <= '9')
    {
      result = (result << 4) | (c - '0');
    }
    else
    {
      break;
    }
  }

  return result;
}